

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

optional<double> assign_d(string_view value,double mindef,double maxdef)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 in_RAX;
  bool bVar3;
  ulong __n;
  undefined1 auVar4 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar5 [64];
  optional<double> oVar6;
  double result;
  char buffer [513];
  ulong local_220;
  undefined1 local_218 [520];
  
  auVar5._8_56_ = in_register_00001208;
  auVar5._0_8_ = mindef;
  __n = value._M_len;
  if (__n < 0x201) {
    memset(local_218,0,0x201);
    if (__n != 0) {
      memcpy(local_218,value._M_str,__n);
    }
    local_220 = 0;
    in_RAX = __isoc99_sscanf(local_218,"%lf",&local_220);
    bVar3 = (int)in_RAX == 0;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_220;
  }
  else {
    bVar3 = true;
    auVar4 = auVar5._0_16_;
  }
  uVar1 = vcmppd_avx512vl(auVar4,auVar5._0_16_,6);
  uVar2 = vcmppd_avx512vl(ZEXT816(0) << 0x40,auVar4,6);
  oVar6.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _8_8_ = CONCAT71((int7)((ulong)in_RAX >> 8),~((byte)uVar2 & 3 | (byte)uVar1 & 3 | bVar3)) &
          0xffffffff00000001;
  oVar6.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_payload = auVar4._0_8_;
  return (optional<double>)
         oVar6.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double>;
}

Assistant:

constexpr static std::optional<double>
assign_d(std::string_view value, double mindef, double maxdef)
{
    auto result = ::to_double(value);

    if (result.has_value() && *result >= mindef && *result <= maxdef)
        return *result;
    else
        return std::nullopt;
}